

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pointer __thiscall
pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
make_terminal_matcher<pstore::json::details::number_matcher<callbacks_proxy<mock_json_callbacks>>>
          (parser<callbacks_proxy<mock_json_callbacks>> *this)

{
  long lVar1;
  _Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  extraout_RDX;
  long *in_RSI;
  pointer pVar2;
  
  lVar1 = *in_RSI;
  details::number_matcher<callbacks_proxy<mock_json_callbacks>_>::number_matcher
            ((number_matcher<callbacks_proxy<mock_json_callbacks>_> *)(lVar1 + 0x30));
  *this = (parser<callbacks_proxy<mock_json_callbacks>>)0x0;
  *(number_matcher<callbacks_proxy<mock_json_callbacks>_> **)(this + 8) =
       (number_matcher<callbacks_proxy<mock_json_callbacks>_> *)(lVar1 + 0x30);
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl = extraout_RDX._M_head_impl;
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._0_8_ = this;
  return (pointer)pVar2._M_t.
                  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ;
}

Assistant:

auto parser<Callbacks>::make_terminal_matcher (Args &&... args) -> pointer {
            static_assert (sizeof (Matcher) <= sizeof (decltype (singletons_->terminal)),
                           "terminal storage is not large enough for Matcher type");
            static_assert (alignof (Matcher) <= alignof (decltype (singletons_->terminal)),
                           "terminal storage is not sufficiently aligned for Matcher type");

            return pointer (new (&singletons_->terminal) Matcher (std::forward<Args> (args)...),
                            typename pointer::deleter_type{false});
        }